

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

double duckdb::NoInfiniteNoZeroDoubleWrapper<duckdb::CotOperator>::Operation<double,double>
                 (double input)

{
  OutOfRangeException *pOVar1;
  bool bVar2;
  allocator local_41;
  double local_40;
  string local_38;
  
  local_40 = input;
  bVar2 = duckdb::Value::IsFinite<double>(input);
  if (bVar2) {
    if ((local_40 == 0.0) && (!NAN(local_40))) {
      pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,
                 "input value %lf is out of range for numeric function cotangent",&local_41);
      OutOfRangeException::OutOfRangeException<double>(pOVar1,&local_38,local_40);
      __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_40 = tan(local_40);
    local_40 = 1.0 / local_40;
  }
  else {
    bVar2 = duckdb::Value::IsNan<double>(local_40);
    if (!bVar2) {
      pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"input value %lf is out of range for numeric function",
                 &local_41);
      OutOfRangeException::OutOfRangeException<double>(pOVar1,&local_38,local_40);
      __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return local_40;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input) {
		if (DUCKDB_UNLIKELY(!Value::IsFinite(input))) {
			if (Value::IsNan(input)) {
				return input;
			}
			throw OutOfRangeException("input value %lf is out of range for numeric function", input);
		}
		if (DUCKDB_UNLIKELY((double)input == 0.0 || (double)input == -0.0)) {
			throw OutOfRangeException("input value %lf is out of range for numeric function cotangent", input);
		}
		return OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input);
	}